

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

Expression *
slang::ast::ConditionalExpression::fromSyntax
          (Compilation *comp,ConditionalExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *psVar1;
  ConditionalPredicateSyntax *pCVar2;
  Pattern *this;
  ExpressionSyntax *pEVar3;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  ConditionalPatternSyntax *pCVar9;
  int *piVar10;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar11;
  Expression *pEVar12;
  Expression *this_00;
  Type *pTVar13;
  undefined4 extraout_var_00;
  ConditionalExpression *expr;
  Type *pTVar14;
  SourceLocation location;
  Diagnostic *diag;
  Diagnostic *diag_00;
  SymbolKind SVar15;
  ulong uVar16;
  bitmask<slang::ast::ASTFlags> extraFlags;
  Type *pTVar17;
  Type *this_01;
  EVP_PKEY_CTX *src;
  size_t index;
  bitmask<slang::ast::ASTFlags> extraFlags_00;
  Type *pTVar18;
  byte bVar19;
  bool bVar20;
  ASTContext trueContext;
  VarMap patternVarMap;
  SmallVector<slang::ast::ConditionalExpression::Condition,_2UL> conditions;
  byte local_1a1;
  char *local_178;
  ASTContext local_168;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_128;
  char local_108;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *local_a8;
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>_>
  local_a0;
  SmallVectorBase<slang::ast::ConditionalExpression::Condition> local_78;
  SourceRange local_40;
  undefined4 extraout_var;
  
  local_78.data_ = (pointer)local_78.firstElement;
  local_78.len = 0;
  local_78.cap = 2;
  local_168.assertionInstance = context->assertionInstance;
  local_168.scope.ptr = (context->scope).ptr;
  local_168.lookupIndex = context->lookupIndex;
  local_168._12_4_ = *(undefined4 *)&context->field_0xc;
  local_168.flags.m_bits = (context->flags).m_bits;
  local_168.instanceOrProc = context->instanceOrProc;
  local_168.firstTempVar = context->firstTempVar;
  local_168.randomizeDetails = context->randomizeDetails;
  pCVar2 = (syntax->predicate).ptr;
  if (pCVar2 == (ConditionalPredicateSyntax *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<slang::syntax::ConditionalPredicateSyntax *>::get() const [T = slang::syntax::ConditionalPredicateSyntax *]"
              );
  }
  uVar8 = (pCVar2->conditions).elements.size_ + 1;
  if (uVar8 < 2) {
    local_1a1 = 1;
    bVar6 = false;
    bVar19 = 1;
    bVar20 = false;
  }
  else {
    bVar19 = 1;
    local_178 = 
    "T slang::not_null<slang::syntax::PatternSyntax *>::get() const [T = slang::syntax::PatternSyntax *]"
    ;
    bVar20 = false;
    local_1a1 = 1;
    bVar6 = false;
    index = 0;
    do {
      pCVar9 = slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::
               operator[](&pCVar2->conditions,index);
      pEVar3 = (pCVar9->expr).ptr;
      if (pEVar3 == (ExpressionSyntax *)0x0) {
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,
                   "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
                  );
      }
      pEVar12 = Expression::selfDetermined
                          (comp,pEVar3,&local_168,(bitmask<slang::ast::ASTFlags>)0x0);
      bVar4 = Expression::bad(pEVar12);
      if (pCVar9->matchesClause == (MatchesClauseSyntax *)0x0) {
        pTVar18 = (pEVar12->type).ptr;
        if (pTVar18 == (Type *)0x0) {
          assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x26,
                     "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                    );
        }
        bVar5 = Type::isFourState(pTVar18);
        bVar6 = (bool)(bVar6 | bVar5);
        if ((bVar20 | bVar4) == 0) {
          bVar20 = ASTContext::requireBooleanConvertible(&local_168,pEVar12);
          bVar20 = !bVar20;
          piVar10 = (int *)0x0;
          goto LAB_003c5352;
        }
        bVar20 = true;
        piVar10 = (int *)0x0;
      }
      else {
        local_a8 = &local_128;
        local_a0.
        super_StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>
        .storage = (StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>
                    *)local_a8;
        local_a0.entries =
             ska::detailv3::
             empty_default_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PatternVarSymbol_const*>>
                       ();
        local_a0.num_slots_minus_one = 0;
        local_a0.hash_policy.shift = '?';
        local_a0.max_lookups = '\x03';
        local_a0._max_load_factor = 0.5;
        local_a0.num_elements = 0;
        this = (Pattern *)(pCVar9->matchesClause->pattern).ptr;
        if (this == (Pattern *)0x0) {
LAB_003c59f1:
          assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x26,local_178);
        }
        pTVar18 = (pEVar12->type).ptr;
        if (pTVar18 == (Type *)0x0) {
          local_178 = 
          "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
          goto LAB_003c59f1;
        }
        iVar7 = Pattern::bind(this,(int)pTVar18,(sockaddr *)&local_128,(socklen_t)&local_168);
        piVar10 = (int *)CONCAT44(extraout_var,iVar7);
        bVar20 = (bool)(bVar20 | bVar4 | *piVar10 == 0);
        ska::detailv3::
        sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>_>
        ::~sherwood_v3_table(&local_a0);
        bVar19 = 0;
LAB_003c5352:
        if ((bVar20 == false) && (bVar19 != 0)) {
          ASTContext::tryEval((ConstantValue *)&local_128,&local_168,pEVar12);
          if (local_108 == '\0') {
            bVar19 = 0;
          }
          else if ((local_108 == '\x01') &&
                  (pvVar11 = std::
                             get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                       ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                         *)&local_128),
                  (pvVar11->super_SVIntStorage).unknownFlag != false)) {
            bVar19 = 0;
          }
          else {
            bVar4 = ConstantValue::isTrue((ConstantValue *)&local_128);
            local_1a1 = local_1a1 & bVar4;
          }
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&local_128);
        }
      }
      local_128._0_8_ = pEVar12;
      local_128._8_8_ = piVar10;
      SmallVectorBase<slang::ast::ConditionalExpression::Condition>::
      emplace_back<slang::ast::ConditionalExpression::Condition>(&local_78,(Condition *)&local_128);
      index = index + 1;
    } while (uVar8 >> 1 != index);
  }
  uVar16 = (ulong)((uint)(bVar19 & local_1a1) * 2);
  uVar8 = (context->flags).m_bits & 0x1800;
  extraFlags_00.m_bits = uVar16 + 0x800;
  if (uVar8 != 0x1800) {
    extraFlags_00.m_bits = uVar16;
  }
  pEVar3 = (syntax->left).ptr;
  if (pEVar3 == (ExpressionSyntax *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
              );
  }
  uVar16 = 0;
  if (bVar19 != 0) {
    uVar16 = (ulong)(((byte)~local_1a1 & 1) * 2);
  }
  extraFlags.m_bits = uVar16 + 0x800;
  if ((int)uVar8 != 0x1800) {
    extraFlags.m_bits = uVar16;
  }
  pEVar12 = Expression::create(comp,pEVar3,&local_168,extraFlags,assignmentTarget);
  pEVar3 = (syntax->right).ptr;
  if (pEVar3 == (ExpressionSyntax *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
              );
  }
  this_00 = Expression::create(comp,pEVar3,context,extraFlags_00,assignmentTarget);
  bVar4 = Expression::bad(pEVar12);
  bVar5 = true;
  if (!bVar4) {
    bVar5 = Expression::bad(this_00);
  }
  pTVar18 = (pEVar12->type).ptr;
  if (pTVar18 == (Type *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
              );
  }
  this_01 = (this_00->type).ptr;
  if (this_01 == (Type *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
              );
  }
  pTVar13 = pTVar18->canonical;
  if (pTVar13 == (Type *)0x0) {
    Type::resolveCanonical(pTVar18);
    pTVar13 = pTVar18->canonical;
  }
  pTVar14 = comp->intType;
  if ((pTVar13->super_Symbol).kind == UnboundedType) {
    pTVar18 = pTVar14;
  }
  pTVar13 = this_01->canonical;
  if (pTVar13 == (Type *)0x0) {
    Type::resolveCanonical(this_01);
    pTVar13 = this_01->canonical;
    pTVar14 = comp->intType;
  }
  if ((pTVar13->super_Symbol).kind == UnboundedType) {
    this_01 = pTVar14;
  }
  pTVar13 = Expression::binaryOperatorType(comp,pTVar18,this_01,bVar6,false);
  iVar7 = SmallVectorBase<slang::ast::ConditionalExpression::Condition>::copy
                    (&local_78,(EVP_PKEY_CTX *)comp,src);
  local_128._0_8_ = CONCAT44(extraout_var_00,iVar7);
  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  expr = BumpAllocator::
         emplace<slang::ast::ConditionalExpression,slang::ast::Type_const&,nonstd::span_lite::span<slang::ast::ConditionalExpression::Condition,18446744073709551615ul>,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange>
                   (&comp->super_BumpAllocator,pTVar13,
                    (span<slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> *)
                    &local_128,pEVar12,this_00,&local_40);
  if (bVar20 != false || bVar5 != false) {
    expr = (ConditionalExpression *)Expression::badExpr(comp,&expr->super_Expression);
    goto LAB_003c578a;
  }
  bVar6 = Type::isNumeric(pTVar18);
  if ((!bVar6) || (bVar6 = Type::isNumeric(this_01), !bVar6)) {
    pTVar13 = pTVar18->canonical;
    if (pTVar13 == (Type *)0x0) {
      Type::resolveCanonical(pTVar18);
      pTVar13 = pTVar18->canonical;
    }
    SVar15 = (pTVar13->super_Symbol).kind;
    if (SVar15 == NullType) {
      pTVar13 = this_01->canonical;
      if (pTVar13 == (Type *)0x0) {
        Type::resolveCanonical(this_01);
        pTVar13 = this_01->canonical;
      }
      if ((pTVar13->super_Symbol).kind != NullType) {
        pTVar13 = pTVar18->canonical;
        if (pTVar13 == (Type *)0x0) {
          Type::resolveCanonical(pTVar18);
          pTVar13 = pTVar18->canonical;
        }
        SVar15 = (pTVar13->super_Symbol).kind;
        goto LAB_003c56ae;
      }
      pTVar14 = Compilation::getNullType(comp);
    }
    else {
LAB_003c56ae:
      pTVar14 = pTVar18;
      if (SVar15 != ClassType) {
        pTVar17 = this_01->canonical;
        if (pTVar17 == (Type *)0x0) {
          Type::resolveCanonical(this_01);
          pTVar17 = this_01->canonical;
          pTVar13 = pTVar18->canonical;
        }
        if ((pTVar17->super_Symbol).kind == ClassType) {
LAB_003c56d2:
          if (pTVar13 == (Type *)0x0) {
            Type::resolveCanonical(pTVar18);
            pTVar13 = pTVar18->canonical;
          }
          goto LAB_003c56e4;
        }
        if (pTVar13 == (Type *)0x0) {
          Type::resolveCanonical(pTVar18);
          pTVar13 = pTVar18->canonical;
        }
        if ((pTVar13->super_Symbol).kind == CHandleType) goto LAB_003c5728;
        pTVar17 = this_01->canonical;
        if (pTVar17 == (Type *)0x0) {
          Type::resolveCanonical(this_01);
          pTVar17 = this_01->canonical;
          pTVar13 = pTVar18->canonical;
        }
        if ((pTVar17->super_Symbol).kind == CHandleType) goto LAB_003c56d2;
        if (pTVar13 == (Type *)0x0) {
          Type::resolveCanonical(pTVar18);
          pTVar13 = pTVar18->canonical;
        }
        if ((pTVar13->super_Symbol).kind == EventType) goto LAB_003c5728;
        pTVar17 = this_01->canonical;
        if (pTVar17 == (Type *)0x0) {
          Type::resolveCanonical(this_01);
          pTVar17 = this_01->canonical;
          pTVar13 = pTVar18->canonical;
        }
        if ((pTVar17->super_Symbol).kind == EventType) goto LAB_003c56d2;
        if (pTVar13 == (Type *)0x0) {
          Type::resolveCanonical(pTVar18);
          pTVar13 = pTVar18->canonical;
        }
        if ((pTVar13->super_Symbol).kind == VirtualInterfaceType) goto LAB_003c5728;
        pTVar17 = this_01->canonical;
        if (pTVar17 == (Type *)0x0) {
          Type::resolveCanonical(this_01);
          pTVar17 = this_01->canonical;
          pTVar13 = pTVar18->canonical;
        }
        if ((pTVar17->super_Symbol).kind == VirtualInterfaceType) goto LAB_003c56d2;
        if (pTVar13 == (Type *)0x0) {
          Type::resolveCanonical(pTVar18);
          pTVar13 = pTVar18->canonical;
        }
        if ((pTVar13->super_Symbol).kind == CovergroupType) goto LAB_003c5728;
        pTVar13 = this_01->canonical;
        if (pTVar13 == (Type *)0x0) {
          Type::resolveCanonical(this_01);
          pTVar13 = this_01->canonical;
        }
        if ((pTVar13->super_Symbol).kind == CovergroupType) {
          pTVar13 = pTVar18->canonical;
          goto LAB_003c56d2;
        }
        bVar6 = Type::isEquivalent(pTVar18,this_01);
        if (bVar6) {
          pTVar13 = pTVar18->canonical;
          if (pTVar13 == (Type *)0x0) {
            Type::resolveCanonical(pTVar18);
            pTVar13 = pTVar18->canonical;
          }
          if ((pTVar13->super_Symbol).kind != UnpackedUnionType) goto LAB_003c5756;
        }
        bVar6 = Expression::isImplicitString(pEVar12);
        if ((bVar6) && (bVar6 = Expression::isImplicitString(this_00), bVar6)) {
          pTVar14 = comp->stringType;
          if (comp->stringType == (Type *)0x0) {
            assert::assertFailed
                      ("ptr",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                       ,0x1b,
                       "slang::not_null<const slang::ast::Type *>::not_null(U &&) [T = const slang::ast::Type *, U = const slang::ast::Type *]"
                      );
          }
          goto LAB_003c5756;
        }
LAB_003c57f3:
        location = parsing::Token::location(&syntax->question);
        diag = ASTContext::addDiag(context,(DiagCode)0x200007,location);
        diag_00 = ast::operator<<(diag,pTVar18);
        ast::operator<<(diag_00,this_01);
        Diagnostic::operator<<(diag,pEVar12->sourceRange);
        Diagnostic::operator<<(diag,this_00->sourceRange);
        expr = (ConditionalExpression *)Expression::badExpr(comp,&expr->super_Expression);
        goto LAB_003c578a;
      }
LAB_003c56e4:
      if ((pTVar13->super_Symbol).kind == NullType) {
        pTVar14 = this_01;
        if (this_01 == (Type *)0x0) {
          assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x1b,
                     "slang::not_null<const slang::ast::Type *>::not_null(U &&) [T = const slang::ast::Type *, U = const slang::ast::Type *&]"
                    );
        }
      }
      else {
LAB_003c5728:
        pTVar13 = this_01->canonical;
        if (pTVar13 == (Type *)0x0) {
          Type::resolveCanonical(this_01);
          pTVar13 = this_01->canonical;
        }
        if (((((pTVar13->super_Symbol).kind != NullType) &&
             (bVar6 = Type::isAssignmentCompatible(this_01,pTVar18), pTVar14 = this_01, !bVar6)) &&
            (bVar6 = Type::isAssignmentCompatible(pTVar18,this_01), pTVar14 = pTVar18, !bVar6)) &&
           ((pTVar14 = Type::getCommonBase(pTVar18,this_01), pTVar14 == (Type *)0x0 &&
            (bVar6 = Type::isEquivalent(pTVar18,this_01), pTVar14 = pTVar18, !bVar6))))
        goto LAB_003c57f3;
      }
    }
LAB_003c5756:
    (expr->super_Expression).type.ptr = pTVar14;
  }
  psVar1 = &(syntax->attributes).
            super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>;
  syntax_00.data_ = psVar1->data_;
  syntax_00.size_ = psVar1->size_;
  if ((syntax->attributes).
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ != 0 &&
      psVar1->data_ == (pointer)0x0) {
    std::terminate();
  }
  ASTContext::setAttributes(context,&expr->super_Expression,syntax_00);
LAB_003c578a:
  if (local_78.data_ != (pointer)local_78.firstElement) {
    free(local_78.data_);
  }
  return &expr->super_Expression;
}

Assistant:

Expression& ConditionalExpression::fromSyntax(Compilation& comp,
                                              const ConditionalExpressionSyntax& syntax,
                                              const ASTContext& context,
                                              const Type* assignmentTarget) {
    bool bad = false;
    bool isConst = true;
    bool isTrue = true;
    bool isFourState = false;
    SmallVector<Condition> conditions;
    ASTContext trueContext = context;

    for (auto condSyntax : syntax.predicate->conditions) {
        auto& cond = selfDetermined(comp, *condSyntax->expr, trueContext);
        bad |= cond.bad();

        const Pattern* pattern = nullptr;
        if (condSyntax->matchesClause) {
            Pattern::VarMap patternVarMap;
            pattern = &Pattern::bind(*condSyntax->matchesClause->pattern, *cond.type, patternVarMap,
                                     trueContext);

            // We don't consider the condition to be const if there's a pattern.
            isConst = false;
            bad |= pattern->bad();
        }
        else {
            isFourState |= cond.type->isFourState();
            if (!bad && !trueContext.requireBooleanConvertible(cond))
                bad = true;
        }

        if (!bad && isConst) {
            ConstantValue condVal = trueContext.tryEval(cond);
            if (!condVal || (condVal.isInteger() && condVal.integer().hasUnknown()))
                isConst = false;
            else if (!condVal.isTrue())
                isTrue = false;
        }

        conditions.push_back({&cond, pattern});
    }

    // If the predicate is known at compile time, we can tell which branch will be unevaluated.
    bitmask<ASTFlags> leftFlags = ASTFlags::None;
    bitmask<ASTFlags> rightFlags = ASTFlags::None;
    if (isConst) {
        if (isTrue)
            rightFlags = ASTFlags::UnevaluatedBranch;
        else
            leftFlags = ASTFlags::UnevaluatedBranch;
    }

    // Pass through the flag allowing unbounded literals.
    if (context.flags.has(ASTFlags::AllowUnboundedLiteral) &&
        context.flags.has(ASTFlags::AllowUnboundedLiteralArithmetic)) {
        leftFlags |= ASTFlags::AllowUnboundedLiteral;
        rightFlags |= ASTFlags::AllowUnboundedLiteral;
    }

    auto& left = create(comp, *syntax.left, trueContext, leftFlags, assignmentTarget);
    auto& right = create(comp, *syntax.right, context, rightFlags, assignmentTarget);
    bad |= left.bad() || right.bad();

    const Type* lt = left.type;
    const Type* rt = right.type;
    if (lt->isUnbounded())
        lt = &comp.getIntType();
    if (rt->isUnbounded())
        rt = &comp.getIntType();

    // Force four-state return type for ambiguous condition case.
    const Type* resultType = binaryOperatorType(comp, lt, rt, isFourState);
    auto result = comp.emplace<ConditionalExpression>(*resultType, conditions.copy(comp), left,
                                                      right, syntax.sourceRange());
    if (bad)
        return badExpr(comp, result);

    // If both sides of the expression are numeric, we've already determined the correct
    // result type. Otherwise, follow the rules in [11.14.11].
    bool good = true;
    if (!lt->isNumeric() || !rt->isNumeric()) {
        if (lt->isNull() && rt->isNull()) {
            result->type = &comp.getNullType();
        }
        else if (lt->isClass() || rt->isClass() || lt->isCHandle() || rt->isCHandle() ||
                 lt->isEvent() || rt->isEvent() || lt->isVirtualInterface() ||
                 rt->isVirtualInterface() || lt->isCovergroup() || rt->isCovergroup()) {
            if (lt->isNull())
                result->type = rt;
            else if (rt->isNull())
                result->type = lt;
            else if (rt->isAssignmentCompatible(*lt))
                result->type = rt;
            else if (lt->isAssignmentCompatible(*rt))
                result->type = lt;
            else if (auto common = Type::getCommonBase(*lt, *rt))
                result->type = common;
            else if (lt->isEquivalent(*rt))
                result->type = lt;
            else
                good = false;
        }
        else if (lt->isEquivalent(*rt) && !lt->isUnpackedUnion()) {
            result->type = lt;
        }
        else if (left.isImplicitString() && right.isImplicitString()) {
            result->type = &comp.getStringType();
        }
        else {
            good = false;
        }
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadConditionalExpression, syntax.question.location());
        diag << *lt << *rt;
        diag << left.sourceRange;
        diag << right.sourceRange;
        return badExpr(comp, result);
    }

    context.setAttributes(*result, syntax.attributes);
    return *result;
}